

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamFtp_p.cpp
# Opt level: O0

bool __thiscall
BamTools::Internal::BamFtp::SendCommand(BamFtp *this,string *command,bool waitForReply)

{
  bool bVar1;
  int64_t iVar2;
  byte in_DL;
  uint in_stack_fffffffffffffefc;
  char *in_stack_ffffffffffffff00;
  allocator *paVar3;
  BamFtp *in_stack_ffffffffffffff08;
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  IBamIODevice *in_stack_ffffffffffffff70;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [39];
  byte local_19;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  local_19 = in_DL & 1;
  bVar1 = TcpSocket::IsConnected((TcpSocket *)in_stack_ffffffffffffff08);
  if (bVar1) {
    std::__cxx11::string::c_str();
    std::__cxx11::string::length();
    iVar2 = WriteCommandSocket(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                               in_stack_fffffffffffffefc);
    if (iVar2 == -1) {
      paVar3 = &local_a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xffffffffffffff60,"BamFtp::SendCommand",paVar3);
      paVar3 = &local_c9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c8,"error writing to socket",paVar3);
      IBamIODevice::SetErrorString
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      std::__cxx11::string::~string(local_c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      bVar1 = false;
    }
    else if ((local_19 & 1) == 0) {
      bVar1 = true;
    }
    else {
      bVar1 = ReceiveReply((BamFtp *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"BamFtp::SendCommand",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"command socket not connected",&local_79);
    IBamIODevice::SetErrorString
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool BamFtp::SendCommand(const string& command, bool waitForReply) {

    // failure if not connected
    if ( !m_commandSocket->IsConnected() ) {
        SetErrorString("BamFtp::SendCommand", "command socket not connected");
        return false;
    }

    // write command to 'command socket'
    if ( WriteCommandSocket(command.c_str(), command.length()) == -1 ) {
        SetErrorString("BamFtp::SendCommand", "error writing to socket");
        // get actual error from command socket??
        return false;
    }

    // if we sent a command that receives a response
    if ( waitForReply )
        return ReceiveReply();

    // return success
    return true;
}